

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::Quadrify(ContourVector *contours,TempMesh *curmesh)

{
  bool bVar1;
  size_type __n;
  reference pPVar2;
  value_type *val;
  const_iterator __end2;
  const_iterator __begin2;
  ContourVector *__range2;
  undefined1 local_30 [8];
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  bbs;
  TempMesh *curmesh_local;
  ContourVector *contours_local;
  
  bbs.
  super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)curmesh;
  std::
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ::vector((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
            *)local_30);
  __n = std::
        vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ::size(contours);
  std::
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ::reserve((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
             *)local_30,__n);
  __end2 = std::
           vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
           ::begin(contours);
  val = (value_type *)
        std::
        vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
        ::end(contours);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
                                *)&val);
    if (!bVar1) break;
    pPVar2 = __gnu_cxx::
             __normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
             ::operator*(&__end2);
    std::
    vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
    ::push_back((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                 *)local_30,&pPVar2->bb);
    __gnu_cxx::
    __normal_iterator<const_Assimp::IFC::ProjectedWindowContour_*,_std::vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>_>
    ::operator++(&__end2);
  }
  Quadrify((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
            *)local_30,
           (TempMesh *)
           bbs.
           super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
  ::~vector((vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
             *)local_30);
  return;
}

Assistant:

void Quadrify(const ContourVector& contours, TempMesh& curmesh)
{
    std::vector<BoundingBox> bbs;
    bbs.reserve(contours.size());

    for(const ContourVector::value_type& val : contours) {
        bbs.push_back(val.bb);
    }

    Quadrify(bbs, curmesh);
}